

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion_exception.hpp
# Opt level: O2

void __thiscall
duckdb::ConversionException::
ConversionException<std::__cxx11::string,unsigned_long,unsigned_long,std::__cxx11::string>
          (ConversionException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          unsigned_long params_1,unsigned_long params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string local_68;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_68,(string *)params);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff78,(string *)params_3);
  Exception::ConstructMessage<std::__cxx11::string,unsigned_long,unsigned_long,std::__cxx11::string>
            (&local_48,(Exception *)msg,&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params_1,params_2,
             (unsigned_long)&stack0xffffffffffffff78,in_stack_ffffffffffffff78);
  ConversionException(this,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  ::std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

explicit ConversionException(const string &msg, ARGS... params)
	    : ConversionException(ConstructMessage(msg, params...)) {
	}